

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O3

FT_Fixed cff_parse_real(FT_Byte *start,FT_Byte *limit,FT_Long power_ten,FT_Long *scaling)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong a_;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  FT_Long FVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  if (scaling != (FT_Long *)0x0) {
    *scaling = 0;
  }
  iVar6 = 4;
  bVar3 = false;
  lVar15 = 0;
  lVar11 = 0;
  uVar12 = 0;
  while( true ) {
    while( true ) {
      a_ = uVar12;
      if ((iVar6 != 0) && (start = start + 1, lVar4 = 0, limit <= start)) goto LAB_0014159e;
      uVar9 = (uint)*start;
      bVar1 = *start >> ((byte)iVar6 & 0x1f);
      uVar10 = bVar1 & 0xf;
      iVar6 = 4 - iVar6;
      uVar12 = a_;
      if (uVar10 != 0xe) break;
      bVar3 = true;
    }
    if (9 < uVar10) break;
    if ((long)a_ < 0xccccccc) {
      if (((bVar1 & 0xf) != 0) || (uVar12 = 0, a_ != 0)) {
        lVar11 = lVar11 + 1;
        uVar12 = (ulong)uVar10 + a_ * 10;
      }
    }
    else {
      lVar15 = lVar15 + 1;
    }
  }
  if (uVar10 == 10) {
    lVar14 = 0;
LAB_001412df:
    do {
      do {
        if (iVar6 != 0) {
          start = start + 1;
          lVar4 = 0;
          if (limit <= start) goto LAB_0014159e;
          uVar9 = (uint)*start;
        }
        uVar10 = uVar9 >> ((byte)iVar6 & 0x1f) & 0xf;
        iVar6 = 4 - iVar6;
        if (9 < uVar10) goto LAB_00141355;
        if ((uVar10 == 0) && (a_ == 0)) {
          lVar15 = lVar15 + -1;
          a_ = 0;
          goto LAB_001412df;
        }
      } while (8 < lVar14 || 0xccccccb < (long)a_);
      lVar14 = lVar14 + 1;
      a_ = (ulong)uVar10 + a_ * 10;
    } while( true );
  }
  lVar14 = 0;
LAB_00141355:
  if (uVar10 - 0xb < 2) {
    bVar2 = false;
    lVar4 = 0;
    while( true ) {
      lVar8 = lVar4;
      if (iVar6 != 0) {
        start = start + 1;
        if (limit <= start) goto LAB_001414b3;
        uVar9 = (uint)*start;
      }
      uVar7 = uVar9 >> ((byte)iVar6 & 0x1f) & 0xf;
      if (9 < uVar7) break;
      iVar6 = 4 - iVar6;
      lVar4 = (ulong)uVar7 + lVar8 * 10;
      if (1000 < lVar8) {
        bVar2 = true;
        lVar4 = lVar8;
      }
    }
    if (a_ == 0) {
LAB_001414b3:
      lVar4 = 0;
      goto LAB_0014159e;
    }
    lVar16 = -lVar8;
    if (uVar10 != 0xc) {
      lVar16 = lVar8;
    }
    if (!bVar2) goto LAB_001413d0;
    lVar4 = 0x7fffffff;
    if (uVar10 != 0xc) goto LAB_0014159e;
  }
  else {
    lVar16 = 0;
    lVar4 = 0;
    if (a_ == 0) goto LAB_0014159e;
LAB_001413d0:
    lVar16 = lVar15 + power_ten + lVar16;
    if (scaling != (FT_Long *)0x0) {
      lVar15 = lVar11 + lVar14;
      uVar12 = lVar11 + lVar16;
      if (5 < lVar15) {
        if ((long)a_ / *(FT_Long *)(cff_standard_encoding + lVar15 * 4 + 0xec) < 0x8000) {
          lVar4 = FT_DivFix(a_,*(FT_Long *)(cff_standard_encoding + lVar15 * 4 + 0xec));
          FVar13 = uVar12 - 5;
        }
        else {
          lVar4 = FT_DivFix(a_,*(FT_Long *)(cff_standard_encoding + lVar15 * 4 + 0xf0));
          FVar13 = uVar12 - 4;
        }
        *scaling = FVar13;
        goto LAB_0014159e;
      }
      if (0x7fff < (long)a_) {
        lVar4 = FT_DivFix(a_,10);
        *scaling = (lVar16 - lVar14) + 1;
        goto LAB_0014159e;
      }
      if ((long)uVar12 < 1) {
LAB_0014151c:
        FVar13 = lVar16 - lVar14;
      }
      else {
        uVar5 = 5;
        if (uVar12 < 5) {
          uVar5 = uVar12;
        }
        if (uVar5 - lVar15 == 0 || (long)uVar5 < lVar15) goto LAB_0014151c;
        FVar13 = uVar12 - uVar5;
        a_ = a_ * power_tens[uVar5 - lVar15];
        if (0x7fff < (long)a_) {
          a_ = a_ / 10;
          FVar13 = FVar13 + 1;
        }
      }
      *scaling = FVar13;
      lVar4 = a_ << 0x10;
      goto LAB_0014159e;
    }
    lVar15 = lVar16 + lVar11;
    lVar4 = 0x7fffffff;
    if (5 < lVar15) goto LAB_0014159e;
    if (-6 < lVar15) {
      if (lVar15 < 0) {
        a_ = (long)a_ / power_tens[-lVar15];
      }
      else {
        lVar11 = -lVar16;
      }
      lVar14 = lVar14 + lVar11;
      uVar12 = (long)a_ / 10;
      if (lVar14 != 10) {
        uVar12 = a_;
      }
      lVar11 = 9;
      if (lVar14 != 10) {
        lVar11 = lVar14;
      }
      if (lVar11 < 1) {
        lVar4 = 0x7fffffff;
        if ((long)(uVar12 * power_tens[-lVar11]) < 0x8000) {
          lVar4 = uVar12 * power_tens[-lVar11] * 0x10000;
        }
        goto LAB_0014159e;
      }
      if ((long)uVar12 / power_tens[lVar11] < 0x8000) {
        lVar4 = FT_DivFix(uVar12,power_tens[lVar11]);
        goto LAB_0014159e;
      }
    }
  }
  lVar4 = 0;
LAB_0014159e:
  lVar11 = -lVar4;
  if (!bVar3) {
    lVar11 = lVar4;
  }
  return lVar11;
}

Assistant:

static FT_Fixed
  cff_parse_real( FT_Byte*  start,
                  FT_Byte*  limit,
                  FT_Long   power_ten,
                  FT_Long*  scaling )
  {
    FT_Byte*  p = start;
    FT_Int    nib;
    FT_UInt   phase;

    FT_Long   result, number, exponent;
    FT_Int    sign = 0, exponent_sign = 0, have_overflow = 0;
    FT_Long   exponent_add, integer_length, fraction_length;


    if ( scaling )
      *scaling = 0;

    result = 0;

    number   = 0;
    exponent = 0;

    exponent_add    = 0;
    integer_length  = 0;
    fraction_length = 0;

    /* First of all, read the integer part. */
    phase = 4;

    for (;;)
    {
      /* If we entered this iteration with phase == 4, we need to */
      /* read a new byte.  This also skips past the initial 0x1E. */
      if ( phase )
      {
        p++;

        /* Make sure we don't read past the end. */
        if ( p >= limit )
          goto Bad;
      }

      /* Get the nibble. */
      nib   = (FT_Int)( p[0] >> phase ) & 0xF;
      phase = 4 - phase;

      if ( nib == 0xE )
        sign = 1;
      else if ( nib > 9 )
        break;
      else
      {
        /* Increase exponent if we can't add the digit. */
        if ( number >= 0xCCCCCCCL )
          exponent_add++;
        /* Skip leading zeros. */
        else if ( nib || number )
        {
          integer_length++;
          number = number * 10 + nib;
        }
      }
    }

    /* Read fraction part, if any. */
    if ( nib == 0xA )
      for (;;)
      {
        /* If we entered this iteration with phase == 4, we need */
        /* to read a new byte.                                   */
        if ( phase )
        {
          p++;

          /* Make sure we don't read past the end. */
          if ( p >= limit )
            goto Bad;
        }

        /* Get the nibble. */
        nib   = ( p[0] >> phase ) & 0xF;
        phase = 4 - phase;
        if ( nib >= 10 )
          break;

        /* Skip leading zeros if possible. */
        if ( !nib && !number )
          exponent_add--;
        /* Only add digit if we don't overflow. */
        else if ( number < 0xCCCCCCCL && fraction_length < 9 )
        {
          fraction_length++;
          number = number * 10 + nib;
        }
      }

    /* Read exponent, if any. */
    if ( nib == 12 )
    {
      exponent_sign = 1;
      nib           = 11;
    }

    if ( nib == 11 )
    {
      for (;;)
      {
        /* If we entered this iteration with phase == 4, */
        /* we need to read a new byte.                   */
        if ( phase )
        {
          p++;

          /* Make sure we don't read past the end. */
          if ( p >= limit )
            goto Bad;
        }

        /* Get the nibble. */
        nib   = ( p[0] >> phase ) & 0xF;
        phase = 4 - phase;
        if ( nib >= 10 )
          break;

        /* Arbitrarily limit exponent. */
        if ( exponent > 1000 )
          have_overflow = 1;
        else
          exponent = exponent * 10 + nib;
      }

      if ( exponent_sign )
        exponent = -exponent;
    }

    if ( !number )
      goto Exit;

    if ( have_overflow )
    {
      if ( exponent_sign )
        goto Underflow;
      else
        goto Overflow;
    }

    /* We don't check `power_ten' and `exponent_add'. */
    exponent += power_ten + exponent_add;

    if ( scaling )
    {
      /* Only use `fraction_length'. */
      fraction_length += integer_length;
      exponent        += integer_length;

      if ( fraction_length <= 5 )
      {
        if ( number > 0x7FFFL )
        {
          result   = FT_DivFix( number, 10 );
          *scaling = exponent - fraction_length + 1;
        }
        else
        {
          if ( exponent > 0 )
          {
            FT_Long  new_fraction_length, shift;


            /* Make `scaling' as small as possible. */
            new_fraction_length = FT_MIN( exponent, 5 );
            shift               = new_fraction_length - fraction_length;

            if ( shift > 0 )
            {
              exponent -= new_fraction_length;
              number   *= power_tens[shift];
              if ( number > 0x7FFFL )
              {
                number   /= 10;
                exponent += 1;
              }
            }
            else
              exponent -= fraction_length;
          }
          else
            exponent -= fraction_length;

          result   = (FT_Long)( (FT_ULong)number << 16 );
          *scaling = exponent;
        }
      }
      else
      {
        if ( ( number / power_tens[fraction_length - 5] ) > 0x7FFFL )
        {
          result   = FT_DivFix( number, power_tens[fraction_length - 4] );
          *scaling = exponent - 4;
        }
        else
        {
          result   = FT_DivFix( number, power_tens[fraction_length - 5] );
          *scaling = exponent - 5;
        }
      }
    }
    else
    {
      integer_length  += exponent;
      fraction_length -= exponent;

      if ( integer_length > 5 )
        goto Overflow;
      if ( integer_length < -5 )
        goto Underflow;

      /* Remove non-significant digits. */
      if ( integer_length < 0 )
      {
        number          /= power_tens[-integer_length];
        fraction_length += integer_length;
      }

      /* this can only happen if exponent was non-zero */
      if ( fraction_length == 10 )
      {
        number          /= 10;
        fraction_length -= 1;
      }

      /* Convert into 16.16 format. */
      if ( fraction_length > 0 )
      {
        if ( ( number / power_tens[fraction_length] ) > 0x7FFFL )
          goto Exit;

        result = FT_DivFix( number, power_tens[fraction_length] );
      }
      else
      {
        number *= power_tens[-fraction_length];

        if ( number > 0x7FFFL )
          goto Overflow;

        result = (FT_Long)( (FT_ULong)number << 16 );
      }
    }

  Exit:
    if ( sign )
      result = -result;

    return result;

  Overflow:
    result = 0x7FFFFFFFL;
    FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    goto Exit;

  Underflow:
    result = 0;
    FT_TRACE4(( "!!!UNDERFLOW:!!!" ));
    goto Exit;

  Bad:
    result = 0;
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    goto Exit;
  }